

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

int __thiscall QFileDialog::open(QFileDialog *this,char *__file,int __oflag,...)

{
  long lVar1;
  FileMode FVar2;
  int __oflag_00;
  char *pcVar3;
  long in_FS_OFFSET;
  QObject local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
  FVar2 = fileMode(this);
  pcVar3 = "2fileSelected(QString)";
  if (FVar2 == ExistingFiles) {
    pcVar3 = "2filesSelected(QStringList)";
  }
  QObject::connect(local_40,(char *)this,(QObject *)pcVar3,__file,(ConnectionType)___oflag);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  QByteArray::operator=((QByteArray *)(lVar1 + 0x3b8),pcVar3);
  QWeakPointer<QObject>::assign<QObject>((QWeakPointer<QObject> *)(lVar1 + 0x390),(QObject *)__file)
  ;
  QByteArray::operator=((QByteArray *)(lVar1 + 0x3a0),___oflag);
  QDialog::open(&this->super_QDialog,___oflag,__oflag_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialog::open(QObject *receiver, const char *member)
{
    Q_D(QFileDialog);
    const char *signal = (fileMode() == ExistingFiles) ? SIGNAL(filesSelected(QStringList))
                                                       : SIGNAL(fileSelected(QString));
    connect(this, signal, receiver, member);
    d->signalToDisconnectOnClose = signal;
    d->receiverToDisconnectOnClose = receiver;
    d->memberToDisconnectOnClose = member;

    QDialog::open();
}